

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_offset.c
# Opt level: O2

int main(void)

{
  uint uVar1;
  uint *puVar2;
  uint16_t v;
  short sVar3;
  uint uVar4;
  int iVar5;
  int64_t offset;
  long lVar6;
  char **ppcVar7;
  ulong uVar8;
  long lVar9;
  container_add_offset_test_state_t *__dest;
  char *pcVar10;
  uint32_t sparse_bitmap [5];
  undefined8 uStack_1a0c0;
  CMUnitTest tests [59];
  long lStack_19780;
  char *apcStack_19778 [9];
  char *pcStack_19730;
  undefined1 *puStack_19728;
  undefined8 uStack_19720;
  undefined8 uStack_19718;
  char *pcStack_196e8;
  undefined1 *puStack_196e0;
  undefined8 uStack_196d8;
  undefined8 uStack_196d0;
  char *pcStack_196a0;
  undefined1 *puStack_19698;
  undefined8 uStack_19690;
  undefined8 uStack_19688;
  char *pcStack_19658;
  undefined1 *puStack_19650;
  undefined8 uStack_19648;
  undefined8 uStack_19640;
  char *pcStack_19610;
  undefined1 *puStack_19608;
  undefined8 uStack_19600;
  undefined8 uStack_195f8;
  char *pcStack_195c8;
  undefined1 *puStack_195c0;
  undefined8 uStack_195b8;
  undefined8 uStack_195b0;
  char *pcStack_19580;
  undefined1 *puStack_19578;
  undefined8 uStack_19570;
  undefined8 uStack_19568;
  char *pcStack_19538;
  undefined1 *puStack_19530;
  undefined8 uStack_19528;
  undefined8 uStack_19520;
  container_add_offset_test_state_t container_state [9];
  uint32_t dense_bitmap [25005];
  
  puVar2 = (uint *)cpuid_Version_info(1);
  uVar8 = (ulong)puVar2[2];
  uVar4 = *puVar2 >> 4;
  uVar1 = uVar4 - 0x2065;
  if (10 < uVar1) {
LAB_001023b1:
    switch(uVar4) {
    case 0x1066:
switchD_0010256c_caseD_1066:
      pcVar10 = "Merom";
      goto LAB_0010268c;
    case 0x1067:
    case 0x106d:
      pcVar10 = "Penryn";
      goto LAB_0010268c;
    case 0x1068:
    case 0x1069:
    case 0x106b:
    case 0x106c:
switchD_0010256c_caseD_1068:
      pcVar10 = "unknown";
      goto LAB_0010268c;
    case 0x106a:
    case 0x106e:
      goto switchD_0010256c_caseD_106a;
    default:
      if (uVar4 - 99 < 2) {
        pcVar10 = "Prescott";
        goto LAB_0010268c;
      }
      if (uVar4 - 0x806c < 2) {
        pcVar10 = "TigerLake";
        goto LAB_0010268c;
      }
      if (uVar4 - 0xa065 < 2) {
        pcVar10 = "Cometlake";
        goto LAB_0010268c;
      }
      if (uVar4 == 0x66) {
        pcVar10 = "Presler";
        goto LAB_0010268c;
      }
      if (uVar4 == 0x6d) {
        pcVar10 = "Dothan";
        goto LAB_0010268c;
      }
      if (uVar4 == 0x6f) goto switchD_0010256c_caseD_1066;
      if (uVar4 == 0x16c) {
        pcVar10 = "Pineview";
        goto LAB_0010268c;
      }
      if (uVar4 == 0x266) {
        pcVar10 = "Lincroft";
        goto LAB_0010268c;
      }
      if (uVar4 == 0x366) {
        pcVar10 = "Cedarview";
        goto LAB_0010268c;
      }
      if (uVar4 == 0x306a) {
        pcVar10 = "IvyBridge";
        goto LAB_0010268c;
      }
      if (uVar4 == 0x306c) {
        pcVar10 = "Haswell";
        goto LAB_0010268c;
      }
      if (uVar4 == 0x306d) {
        pcVar10 = "Broadwell";
        goto LAB_0010268c;
      }
      if (uVar4 == 0x30f1) goto LAB_0010257a;
      if (uVar4 == 0x60f10) {
        pcVar10 = "Zen4";
        goto LAB_0010268c;
      }
      if (uVar4 == 0x506c) {
LAB_001025da:
        pcVar10 = "Goldmont";
        goto LAB_0010268c;
      }
      if (uVar4 == 0x506e) {
        pcVar10 = "Skylake";
        goto LAB_0010268c;
      }
      if (uVar4 == 0x606a) {
LAB_001025e6:
        pcVar10 = "Icelake";
      }
      else {
        if ((uVar4 != 0x60f0) && (uVar4 != 0x60f8)) {
          if (uVar4 == 0x706a) goto LAB_001025da;
          if (uVar4 == 0x706e) goto LAB_001025e6;
          if (uVar4 != 0x70f1) {
            if (uVar4 != 0x806e) {
              if ((uVar4 == 0x9067) || (uVar4 == 0x906a)) {
                pcVar10 = "Alderlake";
                goto LAB_0010268c;
              }
              if (uVar4 != 0x906e) {
                if (uVar4 != 0x90f0) {
                  if (uVar4 == 0xa067) {
                    pcVar10 = "Rocketlake";
                    goto LAB_0010268c;
                  }
                  if (uVar4 == 0xb067) {
                    pcVar10 = "Raptorlake";
                    goto LAB_0010268c;
                  }
                  if (uVar4 != 0x20f10) {
                    if (uVar4 == 0x40f40) {
                      pcVar10 = "Zen3+";
                      goto LAB_0010268c;
                    }
                    if (uVar4 != 0x50f00) {
                      if (uVar4 == 0x406c) {
                        pcVar10 = "CherryTrail";
                        goto LAB_0010268c;
                      }
                      goto switchD_0010256c_caseD_1068;
                    }
                  }
                  pcVar10 = "Zen3";
                  goto LAB_0010268c;
                }
                goto LAB_0010257a;
              }
            }
            pcVar10 = "Kabylake";
            goto LAB_0010268c;
          }
        }
LAB_0010257a:
        pcVar10 = "Zen2";
      }
      goto LAB_0010268c;
    }
  }
  uVar8 = 0x481;
  if ((0x481U >> (uVar1 & 0x1f) & 1) != 0) {
    pcVar10 = "Westmere";
    goto LAB_0010268c;
  }
  uVar8 = 0x120;
  if ((0x120U >> (uVar1 & 0x1f) & 1) != 0) {
    pcVar10 = "SandyBridge";
    goto LAB_0010268c;
  }
  if (uVar1 != 9) goto LAB_001023b1;
switchD_0010256c_caseD_106a:
  pcVar10 = "Nehalem";
LAB_0010268c:
  printf("x64 processor:  %s\t",pcVar10,uVar8);
  printf(" compiler version: %s\t",
         "Clang 19.1.5 (https://github.com/swiftlang/llvm-project.git 188208b14562121ae1ac90190d00d823bcfbccff)"
        );
  putchar(10);
  lVar6 = cpuid(0x80000006);
  if ((char)*(undefined4 *)(lVar6 + 0xc) != '@') {
    lVar6 = cpuid(0x80000006);
    printf("cache line: %d bytes\n",(ulong)(byte)*(undefined4 *)(lVar6 + 0xc),
           (ulong)*(uint *)(lVar6 + 8));
  }
  sVar3 = 100;
  for (lVar6 = 0; lVar6 != 0x708; lVar6 = lVar6 + 2) {
    *(short *)((long)main::range_100_1000 + lVar6) = sVar3;
    sVar3 = sVar3 + 1;
  }
  __dest = container_state;
  memcpy(__dest,&PTR_anon_var_dwarf_249_00130b50,0x288);
  sparse_bitmap[0] = 0x15cc;
  sparse_bitmap[1] = 0x83ba;
  sparse_bitmap[2] = 0xabff;
  sparse_bitmap[3] = 0xdfbc;
  sparse_bitmap[4] = 0x14499;
  for (lVar6 = 0xc; lVar6 != 0x186ac; lVar6 = lVar6 + 4) {
    *(int *)((long)dense_bitmap + lVar6) = (int)lVar6 + 0x18694;
  }
  _assert_true(1,"i == ARRAY_SIZE(dense_bitmap)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
               ,0x143);
  memset(apcStack_19778 + 2,0,0xe00);
  apcStack_19778[0] = "roaring_sparse_bitmap_offset_0";
  apcStack_19778[2] = (char *)0x5;
  pcStack_19730 = "roaring_sparse_bitmap_offset_100";
  uStack_19720 = 5;
  uStack_19718 = 100;
  pcStack_196e8 = "roaring_sparse_bitmap_offset_25000";
  uStack_196d8 = 5;
  uStack_196d0 = 25000;
  pcStack_196a0 = "roaring_sparse_bitmap_offset_83097";
  uStack_19690 = 5;
  uStack_19688 = 0x14499;
  pcStack_19658 = "roaring_sparse_bitmap_offset_UINT32_MAX";
  uStack_19648 = 5;
  uStack_19640 = 0xffffffff;
  pcStack_19610 = "roaring_sparse_bitmap_offset_UINT32_MAX - UINT16_MAX";
  uStack_19600 = 5;
  uStack_195f8 = 0xffff0000;
  pcStack_195c8 = "roaring_sparse_bitmap_offset_UINT32_MAX - UINT16_MAX + 1";
  uStack_195b8 = 5;
  uStack_195b0 = 0xffff0001;
  pcStack_19580 = "roaring_sparse_bitmap_offset_((uint64_t)1) << 50";
  uStack_19570 = 5;
  uStack_19568 = 0x4000000000000;
  pcStack_19538 = "roaring_sparse_bitmap_offset_281474976710657L";
  uStack_19528 = 5;
  uStack_19520 = 0x1000000000001;
  lVar6 = 3;
  for (lVar9 = 0x2a8; lVar9 != 0x608; lVar9 = lVar9 + 0x48) {
    *(char **)((long)&tests[0x3a].setup_func + lVar9) = "roaring_dense_bitmap_offset_offset";
    *(uint32_t **)((long)&tests[0x3a].teardown_func + lVar9) = dense_bitmap;
    *(undefined8 *)((long)&tests[0x3a].initial_state + lVar9) = 0x61ad;
    *(long *)((long)&lStack_19780 + lVar9) = lVar6;
    lVar6 = lVar6 * 3;
    *(undefined8 *)((long)apcStack_19778 + lVar9) = 0;
    *(undefined8 *)((long)apcStack_19778 + lVar9 + 8) = 0;
    *(undefined8 *)((long)apcStack_19778 + lVar9 + 0x10) = 0;
    *(undefined8 *)((long)apcStack_19778 + lVar9 + 0x18) = 0;
    *(undefined8 *)((long)apcStack_19778 + lVar9 + 0x20) = 0;
  }
  lVar6 = 0x400;
  for (lVar9 = 0x608; lVar9 != 0x8d8; lVar9 = lVar9 + 0x48) {
    *(char **)((long)&tests[0x3a].setup_func + lVar9) = "roaring_dense_bitmap_offset_offset";
    *(uint32_t **)((long)&tests[0x3a].teardown_func + lVar9) = dense_bitmap;
    *(undefined8 *)((long)&tests[0x3a].initial_state + lVar9) = 0x61ad;
    *(long *)((long)&lStack_19780 + lVar9) = lVar6;
    lVar6 = lVar6 * 2;
    *(undefined8 *)((long)apcStack_19778 + lVar9) = 0;
    *(undefined8 *)((long)apcStack_19778 + lVar9 + 8) = 0;
    *(undefined8 *)((long)apcStack_19778 + lVar9 + 0x10) = 0;
    *(undefined8 *)((long)apcStack_19778 + lVar9 + 0x18) = 0;
    *(undefined8 *)((long)apcStack_19778 + lVar9 + 0x20) = 0;
  }
  apcStack_19778[1] = (char *)sparse_bitmap;
  puStack_19728 = (undefined1 *)sparse_bitmap;
  puStack_196e0 = (undefined1 *)sparse_bitmap;
  puStack_19698 = (undefined1 *)sparse_bitmap;
  puStack_19650 = (undefined1 *)sparse_bitmap;
  puStack_19608 = (undefined1 *)sparse_bitmap;
  puStack_195c0 = (undefined1 *)sparse_bitmap;
  puStack_19578 = (undefined1 *)sparse_bitmap;
  puStack_19530 = (undefined1 *)sparse_bitmap;
  _assert_true(1,"i <= ARRAY_SIZE(roaring_state)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
               ,0x15e);
  memset(tests,0,0x938);
  for (lVar6 = 0x20; lVar6 != 0x188; lVar6 = lVar6 + 0x28) {
    *(char **)((long)sparse_bitmap + lVar6) = (__dest->test_case).name;
    *(code **)((long)sparse_bitmap + lVar6 + 8) = container_add_offset_test;
    *(code **)((long)sparse_bitmap + lVar6 + 0x10) = setup_container_add_offset_test;
    *(code **)((long)&uStack_1a0c0 + lVar6) = teardown_container_add_offset_test;
    *(container_add_offset_test_state_t **)((long)&tests[0].name + lVar6) = __dest;
    __dest = __dest + 1;
  }
  ppcVar7 = apcStack_19778;
  for (lVar6 = 0x188; lVar6 != 0x958; lVar6 = lVar6 + 0x28) {
    *(char **)((long)sparse_bitmap + lVar6) = *ppcVar7;
    *(code **)((long)sparse_bitmap + lVar6 + 8) = roaring_add_offset_test;
    *(code **)((long)sparse_bitmap + lVar6 + 0x10) = setup_roaring_add_offset_test;
    *(code **)((long)&uStack_1a0c0 + lVar6) = teardown_roaring_add_offset_test;
    *(char ***)((long)&tests[0].name + lVar6) = ppcVar7;
    ppcVar7 = ppcVar7 + 9;
  }
  iVar5 = _cmocka_run_group_tests("tests",tests,0x3b,(CMFixtureFunction)0x0,(CMFixtureFunction)0x0);
  return iVar5;
}

Assistant:

int main() {
    tellmeall();

    static uint16_t range_100_1000[900];
    for (uint16_t i = 0, v = 100; i < 900; i++, v++) {
        range_100_1000[i] = v;
    }
    container_add_offset_test_state_t container_state[] = {
        BITSET_ADD_OFFSET_TEST_CASE(range_100_1000, 123),
        BITSET_ADD_OFFSET_TEST_CASE(range_100_1000, UINT16_MAX),
        BITSET_ADD_OFFSET_TEST_CASE(range_100_1000, UINT16_MAX - 500),
        ARRAY_ADD_OFFSET_TEST_CASE(range_100_1000, 123),
        ARRAY_ADD_OFFSET_TEST_CASE(range_100_1000, UINT16_MAX),
        ARRAY_ADD_OFFSET_TEST_CASE(range_100_1000, UINT16_MAX - 500),
        RUN_ADD_OFFSET_TEST_CASE(range_100_1000, 123),
        RUN_ADD_OFFSET_TEST_CASE(range_100_1000, UINT16_MAX),
        RUN_ADD_OFFSET_TEST_CASE(range_100_1000, UINT16_MAX - 500),
    };

    uint32_t sparse_bitmap[] = {5580, 33722, 44031, 57276, 83097};
    uint32_t dense_bitmap[5 + (200000 - 100000) / 4];
    size_t i, j;

    i = 0;
    dense_bitmap[i++] = 10;
    dense_bitmap[i++] = UINT16_MAX;
    dense_bitmap[i++] = 0x010101;
    for (j = 100000; j < 200000; j += 4) {
        dense_bitmap[i++] = j;
    }
    dense_bitmap[i++] = 400000;
    dense_bitmap[i++] = 1400000;

    assert_true(i == ARRAY_SIZE(dense_bitmap));

    // NB: only add positive offsets, the test function takes care of also
    // running a negative test for that offset.
    roaring_add_offset_test_state_t roaring_state[50] = {
        ROARING_ADD_OFFSET_TEST_CASE(sparse_bitmap, 0),
        ROARING_ADD_OFFSET_TEST_CASE(sparse_bitmap, 100),
        ROARING_ADD_OFFSET_TEST_CASE(sparse_bitmap, 25000),
        ROARING_ADD_OFFSET_TEST_CASE(sparse_bitmap, 83097),
        ROARING_ADD_OFFSET_TEST_CASE(sparse_bitmap, UINT32_MAX),
        ROARING_ADD_OFFSET_TEST_CASE(sparse_bitmap, UINT32_MAX - UINT16_MAX),
        ROARING_ADD_OFFSET_TEST_CASE(sparse_bitmap,
                                     UINT32_MAX - UINT16_MAX + 1),
        ROARING_ADD_OFFSET_TEST_CASE(sparse_bitmap, ((uint64_t)1) << 50),
        ROARING_ADD_OFFSET_TEST_CASE(sparse_bitmap, 281474976710657L),
    };
    i = 9;
    for (int64_t offset = 3; offset < 1000000; offset *= 3) {
        roaring_add_offset_test_state_t state =
            ROARING_ADD_OFFSET_TEST_CASE(dense_bitmap, offset);
        roaring_state[i++] = state;
    }
    for (int64_t offset = 1024; offset < 1000000; offset *= 2) {
        roaring_add_offset_test_state_t state =
            ROARING_ADD_OFFSET_TEST_CASE(dense_bitmap, offset);
        roaring_state[i++] = state;
    }
    assert_true(i <= ARRAY_SIZE(roaring_state));

    i = j = 0;
    struct CMUnitTest
        tests[ARRAY_SIZE(container_state) + ARRAY_SIZE(roaring_state)];
    memset(tests, 0, sizeof(tests));
    for (; i < ARRAY_SIZE(container_state); i++) {
        struct CMUnitTest test = CONTAINER_ADD_OFFSET_TEST(container_state[i]);
        tests[i] = test;
    }
    for (; j < ARRAY_SIZE(roaring_state); i++, j++) {
        struct CMUnitTest test = ROARING_ADD_OFFSET_TEST(roaring_state[j]);
        tests[i] = test;
    }

    return cmocka_run_group_tests(tests, NULL, NULL);
}